

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWriteBench.c
# Opt level: O3

int Io_WriteBenchLut(Abc_Ntk_t *pNtk,char *pFileName)

{
  long *plVar1;
  long *plVar2;
  Abc_Obj_t *pNode;
  long lVar3;
  int iVar4;
  uint uVar5;
  FILE *__stream;
  char *pcVar6;
  char *pcVar7;
  Vec_Int_t *vTruth;
  int *piVar8;
  ProgressBar *p;
  Vec_Ptr_t *pVVar9;
  uint *Sign;
  ulong uVar10;
  ulong uVar11;
  size_t __size;
  long lVar12;
  
  if ((pNtk->ntkFunc != ABC_FUNC_AIG) || (pNtk->ntkType != ABC_NTK_NETLIST)) {
    __assert_fail("Abc_NtkIsAigNetlist(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioWriteBench.c"
                  ,0xb3,"int Io_WriteBenchLut(Abc_Ntk_t *, char *)");
  }
  iVar4 = Io_WriteBenchCheckNames(pNtk);
  if (iVar4 == 0) {
    pcVar7 = 
    "Io_WriteBenchLut(): Signal names in this benchmark contain parentheses making them impossible to reproduce in the BENCH format. Use \"short_names\".\n"
    ;
    __size = 0x93;
  }
  else {
    __stream = fopen(pFileName,"w");
    if (__stream != (FILE *)0x0) {
      pcVar7 = pNtk->pName;
      pcVar6 = Extra_TimeStamp();
      fprintf(__stream,"# Benchmark \"%s\" written by ABC on %s\n",pcVar7,pcVar6);
      pVVar9 = pNtk->vPis;
      if (0 < pVVar9->nSize) {
        lVar12 = 0;
        do {
          pcVar7 = Abc_ObjName(*(Abc_Obj_t **)
                                (*(long *)(*(long *)(*pVVar9->pArray[lVar12] + 0x20) + 8) +
                                (long)**(int **)((long)pVVar9->pArray[lVar12] + 0x30) * 8));
          fprintf(__stream,"INPUT(%s)\n",pcVar7);
          lVar12 = lVar12 + 1;
          pVVar9 = pNtk->vPis;
        } while (lVar12 < pVVar9->nSize);
      }
      pVVar9 = pNtk->vPos;
      if (0 < pVVar9->nSize) {
        lVar12 = 0;
        do {
          pcVar7 = Abc_ObjName(*(Abc_Obj_t **)
                                (*(long *)(*(long *)(*pVVar9->pArray[lVar12] + 0x20) + 8) +
                                (long)**(int **)((long)pVVar9->pArray[lVar12] + 0x20) * 8));
          fprintf(__stream,"OUTPUT(%s)\n",pcVar7);
          lVar12 = lVar12 + 1;
          pVVar9 = pNtk->vPos;
        } while (lVar12 < pVVar9->nSize);
      }
      pVVar9 = pNtk->vBoxes;
      if (0 < pVVar9->nSize) {
        lVar12 = 0;
        do {
          plVar1 = (long *)pVVar9->pArray[lVar12];
          if ((*(uint *)((long)plVar1 + 0x14) & 0xf) == 8) {
            plVar2 = *(long **)(*(long *)(*(long *)(*plVar1 + 0x20) + 8) +
                               (long)*(int *)plVar1[6] * 8);
            pcVar7 = Abc_ObjName(*(Abc_Obj_t **)
                                  (*(long *)(*(long *)(*plVar2 + 0x20) + 8) +
                                  (long)*(int *)plVar2[6] * 8));
            plVar1 = *(long **)(*(long *)(*(long *)(*plVar1 + 0x20) + 8) +
                               (long)*(int *)plVar1[4] * 8);
            pcVar6 = Abc_ObjName(*(Abc_Obj_t **)
                                  (*(long *)(*(long *)(*plVar1 + 0x20) + 8) +
                                  (long)*(int *)plVar1[4] * 8));
            fprintf(__stream,"%-11s = DFFRSE( %s, gnd, gnd, gnd, gnd )\n",pcVar7,pcVar6);
            pVVar9 = pNtk->vBoxes;
          }
          lVar12 = lVar12 + 1;
        } while (lVar12 < pVVar9->nSize);
      }
      vTruth = (Vec_Int_t *)malloc(0x10);
      vTruth->nCap = 10000;
      vTruth->nSize = 0;
      piVar8 = (int *)malloc(40000);
      vTruth->pArray = piVar8;
      p = Extra_ProgressBarStart((FILE *)_stdout,pNtk->vObjs->nSize);
      pVVar9 = pNtk->vObjs;
      if (pVVar9->nSize < 1) {
LAB_0033bf17:
        Extra_ProgressBarStop(p);
        if (vTruth->pArray != (int *)0x0) {
          free(vTruth->pArray);
        }
        free(vTruth);
        if (pNtk->pExdc != (Abc_Ntk_t *)0x0) {
          puts("Io_WriteBench: EXDC is not written (warning).");
        }
        fclose(__stream);
        return 1;
      }
      lVar12 = 0;
LAB_0033bc6e:
      pNode = (Abc_Obj_t *)pVVar9->pArray[lVar12];
      if ((pNode != (Abc_Obj_t *)0x0) && (uVar5 = *(uint *)&pNode->field_0x14, (uVar5 & 0xf) == 7))
      {
        if ((p == (ProgressBar *)0x0) || (p->nItemsNext <= lVar12)) {
          Extra_ProgressBarUpdate_int(p,(int)lVar12,(char *)0x0);
          uVar5 = *(uint *)&pNode->field_0x14;
        }
        if ((uVar5 & 0xf) != 7) {
          __assert_fail("Abc_ObjIsNode(pNode)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioWriteBench.c"
                        ,0x104,"int Io_WriteBenchLutOneNode(FILE *, Abc_Obj_t *, Vec_Int_t *)");
        }
        iVar4 = (pNode->vFanins).nSize;
        if (8 < iVar4) {
          __assert_fail("nFanins <= 8",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioWriteBench.c"
                        ,0x106,"int Io_WriteBenchLutOneNode(FILE *, Abc_Obj_t *, Vec_Int_t *)");
        }
        Sign = Hop_ManConvertAigToTruth
                         ((Hop_Man_t *)pNode->pNtk->pManFunc,
                          (Hop_Obj_t *)((ulong)(pNode->field_5).pData & 0xfffffffffffffffe),iVar4,
                          vTruth,0);
        if (((ulong)pNode->field_5 & 1) == 0) {
          uVar5 = 1 << ((char)iVar4 - 5U & 0x1f);
        }
        else {
          uVar5 = 1 << ((char)iVar4 - 5U & 0x1f);
          uVar10 = (ulong)uVar5;
          if (iVar4 < 6) {
            uVar10 = 1;
          }
          uVar10 = uVar10 + 1;
          do {
            Sign[uVar10 - 2] = ~Sign[uVar10 - 2];
            uVar10 = uVar10 - 1;
          } while (1 < uVar10);
        }
        uVar10 = (ulong)uVar5;
        uVar11 = uVar10;
        if (iVar4 < 6) {
          uVar10 = 1;
          uVar11 = uVar10;
        }
        do {
          if ((long)uVar10 < 1) {
            pcVar7 = Abc_ObjName((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[*(pNode->vFanouts).pArray])
            ;
            pcVar6 = "%-11s = gnd\n";
            goto LAB_0033be27;
          }
          lVar3 = uVar10 - 1;
          uVar10 = uVar10 - 1;
        } while (Sign[lVar3] == 0);
LAB_0033bd4e:
        if (0 < (long)uVar11) goto code_r0x0033bd57;
        pcVar7 = Abc_ObjName((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[*(pNode->vFanouts).pArray]);
        pcVar6 = "%-11s = vdd\n";
LAB_0033be27:
        fprintf(__stream,pcVar6,pcVar7);
      }
      goto LAB_0033be35;
    }
    pcVar7 = "Io_WriteBench(): Cannot open the output file.\n";
    __size = 0x2e;
  }
  fwrite(pcVar7,__size,1,_stdout);
  return 0;
code_r0x0033bd57:
  lVar3 = uVar11 - 1;
  uVar11 = uVar11 - 1;
  if (Sign[lVar3] != 0xffffffff) goto code_r0x0033bd63;
  goto LAB_0033bd4e;
code_r0x0033bd63:
  pcVar7 = Abc_ObjName((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[*(pNode->vFanouts).pArray]);
  if (iVar4 == 1) {
    iVar4 = Abc_NodeIsBuf(pNode);
    Abc_ObjName((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[*(pNode->vFanins).pArray]);
    fprintf(__stream,"%-11s = LUT 0x%d ( %s )\n",pcVar7,(ulong)(2 - (iVar4 == 0)));
  }
  else {
    fprintf(__stream,"%-11s = LUT 0x",pcVar7);
    Extra_PrintHexadecimal((FILE *)__stream,Sign,iVar4);
    fwrite(" (",2,1,__stream);
    if (0 < (pNode->vFanins).nSize) {
      uVar10 = 0;
      do {
        pcVar7 = Abc_ObjName((Abc_Obj_t *)
                             pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[uVar10]]);
        pcVar6 = ",";
        if (iVar4 - 1 == uVar10) {
          pcVar6 = "";
        }
        fprintf(__stream," %s%s",pcVar7,pcVar6);
        uVar10 = uVar10 + 1;
      } while ((long)uVar10 < (long)(pNode->vFanins).nSize);
    }
    fwrite(" )\n",3,1,__stream);
  }
LAB_0033be35:
  lVar12 = lVar12 + 1;
  pVVar9 = pNtk->vObjs;
  if (pVVar9->nSize <= lVar12) goto LAB_0033bf17;
  goto LAB_0033bc6e;
}

Assistant:

int Io_WriteBenchLut( Abc_Ntk_t * pNtk, char * pFileName )
{
    Abc_Ntk_t * pExdc;
    FILE * pFile;
    assert( Abc_NtkIsAigNetlist(pNtk) );
    if ( !Io_WriteBenchCheckNames(pNtk) )
    {
        fprintf( stdout, "Io_WriteBenchLut(): Signal names in this benchmark contain parentheses making them impossible to reproduce in the BENCH format. Use \"short_names\".\n" );
        return 0;
    }
    pFile = fopen( pFileName, "w" );
    if ( pFile == NULL )
    {
        fprintf( stdout, "Io_WriteBench(): Cannot open the output file.\n" );
        return 0;
    }
    fprintf( pFile, "# Benchmark \"%s\" written by ABC on %s\n", pNtk->pName, Extra_TimeStamp() );
    // write the network
    Io_WriteBenchLutOne( pFile, pNtk );
    // write EXDC network if it exists
    pExdc = Abc_NtkExdc( pNtk );
    if ( pExdc )
        printf( "Io_WriteBench: EXDC is not written (warning).\n" );
    // finalize the file
    fclose( pFile );
    return 1;
}